

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5fce8::CtorEvalExternalInterface::applyToModule(CtorEvalExternalInterface *this)

{
  __node_base_ptr *pp_Var1;
  pointer puVar2;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var3;
  EvallingModuleRunner *pEVar4;
  Global *pGVar5;
  _Hash_node_base *p_Var6;
  pointer puVar7;
  __buckets_ptr pp_Var8;
  Builder BVar9;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var10;
  Const *pCVar11;
  long lVar12;
  mapped_type *__x;
  Expression *pEVar13;
  _Base_ptr p_Var14;
  iterator iVar15;
  InsertOrderedSet<wasm::Name> *this_00;
  mapped_type *pmVar16;
  Module *pMVar17;
  Expression **ppEVar18;
  char *pcVar19;
  Index i;
  ulong uVar20;
  pointer puVar21;
  size_t sVar22;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *oldGlobal;
  pointer puVar23;
  Builder BVar24;
  char **ppcVar25;
  undefined1 auVar26 [8];
  __node_base_ptr *pp_Var27;
  string_view sVar28;
  Name name;
  Name NVar29;
  Name memory;
  Name possibleDefiningGlobal;
  undefined1 local_238 [8];
  MustBeBefore mustBeBefore;
  Name global;
  InitScanner scanner;
  undefined1 auStack_a8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  readableGlobals;
  Builder BStack_68;
  Builder builder;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_50;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> curr;
  
  std::
  _Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_(anonymous_namespace)::CtorEvalExternalInterface::DefiningGlobalInfo>,_std::allocator<std::pair<wasm::GCData_*const,_(anonymous_namespace)::CtorEvalExternalInterface::DefiningGlobalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->definingGlobals)._M_h);
  if ((this->startBlock).super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._M_engaged == true) {
    (((this->startBlock).super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._M_payload._M_value)->list).
    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements = 0;
  }
  if ((this->memories)._M_h._M_element_count != 0) {
    pMVar17 = this->wasm;
    puVar2 = (pMVar17->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar23 = (pMVar17->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (puVar23 ==
        (pMVar17->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      BStack_68.wasm = pMVar17;
      wasm::Name::Name((Name *)local_238,"");
      wasm::Name::Name((Name *)auStack_a8,"");
      name.super_IString.str._M_str = (char *)local_238;
      name.super_IString.str._M_len = (size_t)&stack0xffffffffffffffb0;
      memory.super_IString.str._M_str = (char *)auStack_a8;
      memory.super_IString.str._M_len = (size_t)mustBeBefore.Map._M_h._M_buckets;
      wasm::Builder::makeDataSegment
                (name,memory,SUB81(readableGlobals._M_h._M_buckets,0),(Expression *)0x0,(char *)0x0,
                 (Address)0x1641bf);
      wasm::Literal::makeFromInt32
                ((Literal *)&global.super_IString.str._M_str,0,
                 (Type)*(uintptr_t *)
                        ((long)(puVar2->_M_t).
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t + 0x50));
      pCVar11 = wasm::Builder::makeConst
                          (&stack0xffffffffffffff98,(Literal *)&global.super_IString.str._M_str);
      *(Const **)((long)local_50._M_head_impl + 0x30) = pCVar11;
      wasm::Literal::~Literal((Literal *)&global.super_IString.str._M_str);
      _Var10._M_head_impl = local_50._M_head_impl;
      sVar28 = (string_view)wasm::Name::fromInt(0);
      ((_Var10._M_head_impl)->super_Named).name.super_IString.str = sVar28;
      ((_Var10._M_head_impl)->super_Named).hasExplicitName = false;
      _Var3._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (puVar2->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t;
      pcVar19 = *(char **)((long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                 .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      (((Name *)((long)local_50._M_head_impl + 0x18))->super_IString).str._M_len =
           *(size_t *)
            _Var3._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      *(char **)((long)local_50._M_head_impl + 0x20) = pcVar19;
      wasm::Module::addDataSegment((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
                ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                 &stack0xffffffffffffffb0);
      puVar23 = (this->wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    wasm::Expression::cast<wasm::Const>
              (((puVar23->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset);
    lVar12 = wasm::Literal::getInteger();
    if (lVar12 != 0) {
      __assert_fail("segment->offset->cast<Const>()->value.getInteger() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                    ,0x20b,
                    "void (anonymous namespace)::CtorEvalExternalInterface::applyMemoryToModule()");
    }
    __x = std::__detail::
          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&this->memories,
                       (key_type *)
                       (puVar2->_M_t).
                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t)
    ;
    std::vector<char,_std::allocator<char>_>::operator=
              (&((puVar23->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->data,__x);
  }
  pMVar17 = this->wasm;
  if (((pMVar17->features).features & 0x400) == 0) {
    pEVar4 = this->instance;
    for (p_Var14 = (pEVar4->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
                   globals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var14 !=
        &(pEVar4->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals._M_t.
         _M_impl.super__Rb_tree_header; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      pEVar13 = getSerialization(this,(Literals *)&p_Var14[1]._M_left,(Name)ZEXT816(0));
      NVar29.super_IString.str._M_str = *(char **)(p_Var14 + 1);
      NVar29.super_IString.str._M_len = (size_t)this->wasm;
      lVar12 = wasm::Module::getGlobal(NVar29);
      *(Expression **)(lVar12 + 0x40) = pEVar13;
    }
  }
  else {
    BStack_68.wasm =
         (Module *)
         (pMVar17->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    builder.wasm = (Module *)
                   (pMVar17->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    (pMVar17->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pMVar17->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pMVar17->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wasm::Module::updateMaps();
    BVar9.wasm = builder.wasm;
    for (BVar24.wasm = BStack_68.wasm; BVar24.wasm != BVar9.wasm;
        BVar24.wasm = (Module *)
                      &((BVar24.wasm)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
      pGVar5 = ((_Head_base<0UL,_wasm::Global_*,_false> *)
               &((BVar24.wasm)->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl;
      if ((pGVar5->mutable_ == false) && ((pGVar5->type).id == (pGVar5->init->type).id)) {
        sVar22 = *(size_t *)&(pGVar5->super_Importable).super_Named;
        pcVar19 = (pGVar5->super_Importable).super_Named.name.super_IString.str._M_str;
      }
      else {
        pcVar19 = (char *)0x0;
        sVar22 = 0;
      }
      iVar15 = std::
               _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
               ::find(&(this->instance->
                       super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).globals.
                       _M_t,(key_type *)pGVar5);
      if ((_Rb_tree_header *)iVar15._M_node !=
          &(this->instance->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
           globals._M_t._M_impl.super__Rb_tree_header) {
        possibleDefiningGlobal.super_IString.str._M_str = pcVar19;
        possibleDefiningGlobal.super_IString.str._M_len = sVar22;
        pEVar13 = getSerialization(this,(Literals *)&iVar15._M_node[1]._M_left,
                                   possibleDefiningGlobal);
        ((_Head_base<0UL,_wasm::Global_*,_false> *)
        &((BVar24.wasm)->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl->init = pEVar13;
      }
      wasm::Module::addGlobal((unique_ptr *)this->wasm);
    }
    local_238 = (undefined1  [8])&mustBeBefore.Map._M_h._M_rehash_policy._M_next_resize;
    mustBeBefore.Map._M_h._M_buckets = (__buckets_ptr)0x1;
    mustBeBefore.Map._M_h._M_bucket_count = 0;
    mustBeBefore.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    mustBeBefore.Map._M_h._M_element_count._0_4_ = 0x3f800000;
    mustBeBefore.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    mustBeBefore.Map._M_h._M_rehash_policy._4_4_ = 0;
    mustBeBefore.Map._M_h._M_rehash_policy._M_next_resize = 0;
    mustBeBefore.Map._M_h._M_single_bucket =
         (__node_base_ptr)&mustBeBefore.Map._M_h._M_single_bucket;
    mustBeBefore.List.
    super__List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    scanner.unfixableGets.List.
    super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node._M_size
         = (size_t)(this->wasm->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    pp_Var1 = &scanner.unfixableGets.Map._M_h._M_single_bucket;
    mustBeBefore.List.
    super__List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)mustBeBefore.Map._M_h._M_single_bucket;
    for (puVar21 = (this->wasm->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppcVar25 = &global.super_IString.str._M_str,
        puVar21 !=
        (pointer)scanner.unfixableGets.List.
                 super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl.
                 _M_node._M_size; puVar21 = puVar21 + 1) {
      if (*(long *)((long)(puVar21->_M_t).
                          super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                          _M_t + 0x40) != 0) {
        global.super_IString.str._M_str = (char *)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currFunction = (Function *)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].currp =
             (Expression **)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule =
             (Module *)&scanner.unfixableGets.Map._M_h._M_rehash_policy._M_next_resize;
        scanner.unfixableGets.Map._M_h._M_buckets = (__buckets_ptr)0x1;
        scanner.unfixableGets.Map._M_h._M_bucket_count = 0;
        scanner.unfixableGets.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        scanner.unfixableGets.Map._M_h._M_element_count._0_4_ = 0x3f800000;
        scanner.unfixableGets.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        scanner.unfixableGets.Map._M_h._M_rehash_policy._4_4_ = 0;
        scanner.unfixableGets.Map._M_h._M_rehash_policy._M_next_resize = 0;
        scanner.unfixableGets.List.
        super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node.
        super__List_node_base._M_prev = (_List_node_base *)0x0;
        scanner.unfixableGets.Map._M_h._M_single_bucket = (__node_base_ptr)pp_Var1;
        scanner.unfixableGets.List.
        super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)pp_Var1;
        wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)ppcVar25,
                   wasm::PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::scan,
                   (Expression **)
                   ((long)(puVar21->_M_t).
                          super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                          _M_t + 0x40));
        while (pp_Var27 = pp_Var1,
              ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                     super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_start -
               (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                     _M_elems[9].currp >> 4) +
              (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                    super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep != 0) {
          if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                       _M_elems[9].currp ==
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                (Expression **)0x0) {
              pcVar19 = 
              "T &wasm::SmallVector<wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, 10>::back() [T = wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, N = 10]"
              ;
              goto LAB_0014a33b;
            }
            ppEVar18 = scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                       _M_elems[(long)scanner.
                                      super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                      .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                      replacep + -2].currp;
            global.super_IString.str._M_str =
                 (char *)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[(long)scanner.
                                        super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .
                                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .replacep + -1].func;
            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
            super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep =
                 (Expression **)
                 ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep + -1);
          }
          else {
            ppEVar18 = (Expression **)
                       scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                       super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].func;
            global.super_IString.str._M_str =
                 (char *)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible
                         .
                         super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].currp;
            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
            super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                 super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          if (*(Expression **)global.super_IString.str._M_str == (Expression *)0x0) {
            pcVar19 = 
            "void wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::walk(Expression *&) [SubType = InitScanner, VisitorType = wasm::Visitor<InitScanner>]"
            ;
            goto LAB_0014a305;
          }
          (*(code *)ppEVar18)((InitScanner *)ppcVar25,(Expression **)global.super_IString.str._M_str
                             );
        }
        while (pp_Var27 = &(*pp_Var27)->_M_nxt, pp_Var27 != pp_Var1) {
          p_Var6 = ((__node_base_ptr)(pp_Var27 + 2))->_M_nxt;
          wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::operator[]
                    ((InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)local_238,
                     (Name *)(puVar21->_M_t).
                             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                             ._M_t);
          this_00 = wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::
                    operator[]((InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)
                               local_238,(Name *)(p_Var6 + 2));
          wasm::InsertOrderedSet<wasm::Name>::insert
                    (this_00,(Name *)(puVar21->_M_t).
                                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                     ._M_t);
        }
        anon_func::InitScanner::~InitScanner((InitScanner *)&global.super_IString.str._M_str);
      }
    }
    pMVar17 = this->wasm;
    if (mustBeBefore.Map._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      auStack_a8 = (undefined1  [8])
                   (pMVar17->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      readableGlobals._M_h._M_buckets =
           (__buckets_ptr)
           (pMVar17->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      readableGlobals._M_h._M_bucket_count =
           (size_type)
           (pMVar17->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pMVar17->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pMVar17->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pMVar17->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      wasm::Module::updateMaps();
      global.super_IString.str._M_str =
           (char *)&scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                    super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                    _M_elems[1].currp;
      scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)0x1;
      scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.usedFixed = 0;
      scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0].func =
           (TaskFunc)0x0;
      scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0].currp.
      _0_4_ = 0x3f800000;
      scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[1].func =
           (TaskFunc)0x0;
      scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[1].currp =
           (Expression **)0x0;
      for (uVar20 = 0;
          uVar20 < (ulong)((long)readableGlobals._M_h._M_buckets - (long)auStack_a8 >> 3);
          uVar20 = (ulong)((mapped_type)uVar20 + 1)) {
        pmVar16 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&global.super_IString.str._M_str,
                               (key_type *)
                               (((pointer)((long)auStack_a8 + uVar20 * 8))->_M_t).
                               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                               .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        *pmVar16 = (mapped_type)uVar20;
      }
      wasm::TopologicalSort::
      sortOfImpl<std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(&)(const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&),_wasm::TopologicalSort::sort>
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&stack0xffffffffffffffb0,
                 (_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>)
                 mustBeBefore.Map._M_h._M_single_bucket,
                 (_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>)
                 &mustBeBefore.Map._M_h._M_single_bucket);
      for (; (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>
             )local_50._M_head_impl !=
             (__uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>)
             curr._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
          local_50._M_head_impl = local_50._M_head_impl + 0x10) {
        mustBeBefore.List.
        super__List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
        ._M_impl._M_node._M_size = *(size_t *)local_50._M_head_impl;
        global.super_IString.str._M_len = *(size_t *)((long)local_50._M_head_impl + 8);
        pMVar17 = this->wasm;
        std::__detail::
        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&global.super_IString.str._M_str,
                     (key_type *)
                     &mustBeBefore.List.
                      super__List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
                      ._M_impl._M_node._M_size);
        wasm::Module::addGlobal((unique_ptr *)pMVar17);
      }
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)&stack0xffffffffffffffb0);
      pp_Var8 = readableGlobals._M_h._M_buckets;
      for (auVar26 = auStack_a8; auVar26 != (undefined1  [8])pp_Var8;
          auVar26 = (undefined1  [8])((long)auVar26 + 8)) {
        if ((((pointer)auVar26)->_M_t).
            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl != (Global *)0x0) {
          wasm::Module::addGlobal((unique_ptr *)this->wasm);
        }
      }
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&global.super_IString.str._M_str);
      std::
      vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ::~vector((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 *)auStack_a8);
      pMVar17 = this->wasm;
    }
    auStack_a8 = (undefined1  [8])&readableGlobals._M_h._M_rehash_policy._M_next_resize;
    readableGlobals._M_h._M_buckets = (__buckets_ptr)0x1;
    readableGlobals._M_h._M_bucket_count = 0;
    readableGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    readableGlobals._M_h._M_element_count._0_4_ = 0x3f800000;
    readableGlobals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    readableGlobals._M_h._M_rehash_policy._4_4_ = 0;
    readableGlobals._M_h._M_rehash_policy._M_next_resize = 0;
    puVar7 = (pMVar17->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppcVar25 = &global.super_IString.str._M_str;
    for (puVar21 = (pMVar17->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar7;
        puVar21 = puVar21 + 1) {
      pGVar5 = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (pGVar5->init != (Expression *)0x0) {
        global.super_IString.str._M_str = (char *)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].currp =
             (Expression **)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currFunction =
             (Function *)this->wasm;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule = (Module *)this;
        scanner.unfixableGets.Map._M_h._M_buckets = (__buckets_ptr)puVar21;
        scanner.unfixableGets.Map._M_h._M_bucket_count = (size_type)auStack_a8;
        wasm::Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)ppcVar25,
                   wasm::PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::scan,&pGVar5->init)
        ;
        while (((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                      super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                      _M_elems[9].currp >> 4) +
               (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                     super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep != 0) {
          if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                       _M_elems[9].currp ==
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                (Expression **)0x0) {
              pcVar19 = 
              "T &wasm::SmallVector<wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, 10>::back() [T = wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, N = 10]"
              ;
LAB_0014a33b:
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x7e,pcVar19);
            }
            ppEVar18 = scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                       _M_elems[(long)scanner.
                                      super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                      .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                      replacep + -2].currp;
            global.super_IString.str._M_str =
                 (char *)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[(long)scanner.
                                        super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .
                                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                        .replacep + -1].func;
            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
            super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep =
                 (Expression **)
                 ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep + -1);
          }
          else {
            ppEVar18 = (Expression **)
                       scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                       super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].func;
            global.super_IString.str._M_str =
                 (char *)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible
                         .
                         super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].currp;
            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
            super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                 super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          if (*(Expression **)global.super_IString.str._M_str == (Expression *)0x0) {
            pcVar19 = 
            "void wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::walk(Expression *&) [SubType = InitFixer, VisitorType = wasm::Visitor<InitFixer>]"
            ;
LAB_0014a305:
            __assert_fail("*task.currp",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x132,pcVar19);
          }
          (*(code *)ppEVar18)((InitScanner *)ppcVar25,(Expression **)global.super_IString.str._M_str
                             );
        }
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)auStack_a8,
                 (value_type *)
                 (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        wasm::Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::~Walker
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)ppcVar25);
      }
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_a8);
    wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::~InsertOrderedMap
              ((InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)local_238);
    std::
    vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ::~vector((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               *)&stack0xffffffffffffff98);
  }
  return;
}

Assistant:

void applyToModule() {
    clearApplyState();

    // If nothing was ever written to memories then there is nothing to update.
    if (!memories.empty()) {
      applyMemoryToModule();
    }

    applyGlobalsToModule();
  }